

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O3

bool TestDigitalInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  uint8_t mask;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  char buf [80];
  char local_88 [88];
  
  cVar1 = (char)logFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=== DIGITAL INPUTS ===",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  Amp1394Console::Print
            (curLine,9,
             "This tests the loopback on the test board between DOUT4 and all digital inputs");
  bVar11 = qlaNum == 2;
  mask = '\b';
  if (bVar11) {
    mask = 0x80;
  }
  uVar10 = 0xfff;
  if (bVar11) {
    uVar10 = 0xfff0000;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"   All inputs low: ",0x13);
  bVar2 = AmpIO::WriteDigitalOutput(Board,mask,'\0');
  if (bVar2) {
    Amp1394_Sleep(0.001);
    iVar4 = (*Port->_vptr_BasePort[0x1d])(Port);
    if ((char)iVar4 == '\0') {
      builtin_strncpy(local_88 + 10,"read fr",7);
      builtin_strncpy(local_88 + 0x12,"m board",8);
      pcVar8 = " - Failed to read from board";
      lVar7 = 0x1c;
      goto LAB_00105d7c;
    }
    uVar5 = AmpIO::GetDigitalInput(Board);
    uVar9 = (uVar5 & uVar10) >> (bVar11 << 4);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    bVar2 = uVar9 == 0;
    if (bVar2) {
      sprintf(local_88,"Setting all inputs low - PASS (%03lx)",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
    }
    else {
      sprintf(local_88,"Setting all inputs low - FAIL (%03lx)",(ulong)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
    }
  }
  else {
    builtin_strncpy(local_88 + 10,"write t",7);
    builtin_strncpy(local_88 + 0x12," board",7);
    pcVar8 = " - Failed to write to board";
    lVar7 = 0x1b;
LAB_00105d7c:
    local_88[0x11] = 0x6f;
    builtin_strncpy(local_88,"Failed to ",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar8,lVar7);
    bVar2 = false;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  Amp1394Console::Print(curLine + 1,9,local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"   All inputs high: ",0x14)
  ;
  bVar3 = AmpIO::WriteDigitalOutput(Board,mask,mask);
  if (bVar3) {
    Amp1394_Sleep(0.001);
    iVar4 = (*Port->_vptr_BasePort[0x1d])();
    if ((char)iVar4 != '\0') {
      uVar5 = AmpIO::GetDigitalInput(Board);
      uVar10 = (uVar5 & uVar10) >> (bVar11 << 4);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      if (uVar10 == 0xfff) {
        sprintf(local_88,"Setting all inputs high - PASS (%03lx)",0xfff);
        pcVar8 = " - PASS";
      }
      else {
        bVar2 = false;
        sprintf(local_88,"Setting all inputs high - FAIL (%03lx)",(ulong)uVar10);
        pcVar8 = " - FAIL";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar8,7);
      goto LAB_00105f22;
    }
    builtin_strncpy(local_88 + 10,"read fr",7);
    builtin_strncpy(local_88 + 0x12,"m board",8);
    pcVar8 = " - Failed to read from board";
    lVar7 = 0x1c;
  }
  else {
    builtin_strncpy(local_88 + 10,"write t",7);
    builtin_strncpy(local_88 + 0x12," board",7);
    pcVar8 = " - Failed to write to board";
    lVar7 = 0x1b;
  }
  local_88[0x11] = 0x6f;
  builtin_strncpy(local_88,"Failed to ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar8,lVar7);
  bVar2 = false;
LAB_00105f22:
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  Amp1394Console::Print(curLine + 2,9,local_88);
  return bVar2;
}

Assistant:

bool TestDigitalInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    bool pass = true;
    unsigned long data;
    char buf[80];

    logFile << std::endl << "=== DIGITAL INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This tests the loopback on the test board"
                           " between DOUT4 and all digital inputs");

    uint8_t dout4_mask = (qlaNum == 2) ? 0x80 : 0x08;
    uint32_t data_mask = (qlaNum == 2) ? 0x0fff0000 : 0x00000fff;
    int data_shift = (qlaNum == 2) ? 16 : 0;

    logFile << "   All inputs low: ";
    if (Board.WriteDigitalOutput(dout4_mask, 0x00)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (!data) {
                sprintf(buf, "Setting all inputs low - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs low - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    logFile << "   All inputs high: ";
    if (Board.WriteDigitalOutput(dout4_mask, dout4_mask)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (data == 0x0fff) {
                sprintf(buf, "Setting all inputs high - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs high - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    return pass;
}